

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

void __thiscall libebml::EbmlMaster::EbmlMaster(EbmlMaster *this,EbmlMaster *ElementToClone)

{
  int iVar1;
  undefined4 extraout_var;
  pointer ppEVar2;
  pointer ppEVar3;
  allocator_type local_31;
  
  EbmlElement::EbmlElement(&this->super_EbmlElement,&ElementToClone->super_EbmlElement);
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlMaster_001de6f8;
  std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::vector
            (&this->ElementList,
             (long)(ElementToClone->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(ElementToClone->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_31);
  this->Context = ElementToClone->Context;
  this->bChecksumUsed = ElementToClone->bChecksumUsed;
  EbmlCrc32::EbmlCrc32(&this->Checksum,&ElementToClone->Checksum);
  ppEVar2 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppEVar3 = (ElementToClone->ElementList).
                 super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar3 !=
      (ElementToClone->ElementList).
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    iVar1 = (*(*ppEVar3)->_vptr_EbmlElement[2])();
    *ppEVar2 = (EbmlElement *)CONCAT44(extraout_var,iVar1);
    ppEVar2 = ppEVar2 + 1;
  }
  return;
}

Assistant:

EbmlMaster::EbmlMaster(const EbmlMaster & ElementToClone)
 :EbmlElement(ElementToClone)
 ,ElementList(ElementToClone.ListSize())
 ,Context(ElementToClone.Context)
 ,bChecksumUsed(ElementToClone.bChecksumUsed)
 ,Checksum(ElementToClone.Checksum)
{
  // add a clone of the list
  std::vector<EbmlElement *>::const_iterator Itr = ElementToClone.ElementList.begin();
  std::vector<EbmlElement *>::iterator myItr = ElementList.begin();
  while (Itr != ElementToClone.ElementList.end())
  {
    *myItr = (*Itr)->Clone();
    ++Itr; ++myItr;
  }

}